

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra_shortest_paths.hpp
# Opt level: O0

void boost::detail::
     dijkstra_dispatch2<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::iterator_property_map<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,double,double&>,boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,boost::bgl_named_params<boost::detail::_project2nd<double,double>,boost::distance_combine_t,boost::bgl_named_params<std::less<double>,boost::distance_compare_t,boost::bgl_named_params<boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::edge_weight_t,boost::bgl_named_params<unsigned_long*,boost::vertex_predecessor_t,boost::no_property>>>>>
               (undefined8 param_1,undefined8 param_2,undefined8 param_3,undefined4 param_4,
               undefined8 param_5)

{
  unsigned_long *puVar1;
  double dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  type *p;
  type *param;
  unsigned_long **ppuVar5;
  type *param_00;
  type *param_01;
  type *ptVar6;
  type *ptVar7;
  double dVar8;
  D inf;
  dummy_property_map p_map;
  graph_visitor_t in_stack_ffffffffffffff2c;
  dijkstra_visitor<boost::null_visitor> local_8a [2];
  double local_88 [2];
  closed_plus<double> local_78 [2];
  less<double> local_68 [4];
  undefined4 local_64;
  undefined8 local_60;
  undefined8 local_58;
  double local_50 [2];
  double local_40;
  dummy_property_map local_34;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_14;
  undefined8 local_10;
  undefined8 local_8;
  
  local_30 = param_5;
  local_28 = param_2;
  local_20 = param_1;
  local_14 = param_4;
  local_10 = param_3;
  dummy_property_map::dummy_property_map(&local_34);
  p = get_param<boost::distance_inf_t,boost::bgl_named_params<boost::detail::_project2nd<double,double>,boost::distance_combine_t,boost::bgl_named_params<std::less<double>,boost::distance_compare_t,boost::bgl_named_params<boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::edge_weight_t,boost::bgl_named_params<unsigned_long*,boost::vertex_predecessor_t,boost::no_property>>>>>
                (local_30);
  local_50[0] = std::numeric_limits<double>::max();
  local_40 = choose_param<double>(p,local_50);
  uVar4 = local_20;
  uVar3 = local_28;
  param = get_param<boost::vertex_predecessor_t,boost::bgl_named_params<boost::detail::_project2nd<double,double>,boost::distance_combine_t,boost::bgl_named_params<std::less<double>,boost::distance_compare_t,boost::bgl_named_params<boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::edge_weight_t,boost::bgl_named_params<unsigned_long*,boost::vertex_predecessor_t,boost::no_property>>>>>
                    ((bgl_named_params<boost::detail::_project2nd<double,_double>,_boost::distance_combine_t,_boost::bgl_named_params<std::less<double>,_boost::distance_compare_t,_boost::bgl_named_params<boost::adj_list_edge_property_map<boost::undirected_tag,_double,_const_double_&,_unsigned_long,_const_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::edge_weight_t>,_boost::edge_weight_t,_boost::bgl_named_params<unsigned_long_*,_boost::vertex_predecessor_t,_boost::no_property>_>_>_>
                      *)p,in_stack_ffffffffffffff2c);
  ppuVar5 = choose_param<unsigned_long*,boost::dummy_property_map>(param,&local_34);
  puVar1 = *ppuVar5;
  local_60 = local_10;
  local_58 = local_8;
  local_64 = local_14;
  param_00 = get_param<boost::distance_compare_t,boost::bgl_named_params<boost::detail::_project2nd<double,double>,boost::distance_combine_t,boost::bgl_named_params<std::less<double>,boost::distance_compare_t,boost::bgl_named_params<boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::edge_weight_t,boost::bgl_named_params<unsigned_long*,boost::vertex_predecessor_t,boost::no_property>>>>>
                       (local_30);
  choose_param<std::less<double>,std::less<double>>(param_00,local_68);
  param_01 = get_param<boost::distance_combine_t,boost::bgl_named_params<boost::detail::_project2nd<double,double>,boost::distance_combine_t,boost::bgl_named_params<std::less<double>,boost::distance_compare_t,boost::bgl_named_params<boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::edge_weight_t,boost::bgl_named_params<unsigned_long*,boost::vertex_predecessor_t,boost::no_property>>>>>
                       (local_30);
  closed_plus<double>::closed_plus(local_78,local_40);
  choose_param<boost::detail::_project2nd<double,double>,boost::closed_plus<double>>
            (param_01,local_78);
  dVar2 = local_40;
  ptVar6 = get_param<boost::distance_zero_t,boost::bgl_named_params<boost::detail::_project2nd<double,double>,boost::distance_combine_t,boost::bgl_named_params<std::less<double>,boost::distance_compare_t,boost::bgl_named_params<boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::edge_weight_t,boost::bgl_named_params<unsigned_long*,boost::vertex_predecessor_t,boost::no_property>>>>>
                     (local_30);
  local_88[0] = 0.0;
  dVar8 = choose_param<double>(ptVar6,local_88);
  ptVar7 = get_param<boost::graph_visitor_t,boost::bgl_named_params<boost::detail::_project2nd<double,double>,boost::distance_combine_t,boost::bgl_named_params<std::less<double>,boost::distance_compare_t,boost::bgl_named_params<boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::edge_weight_t,boost::bgl_named_params<unsigned_long*,boost::vertex_predecessor_t,boost::no_property>>>>>
                     ((bgl_named_params<boost::detail::_project2nd<double,_double>,_boost::distance_combine_t,_boost::bgl_named_params<std::less<double>,_boost::distance_compare_t,_boost::bgl_named_params<boost::adj_list_edge_property_map<boost::undirected_tag,_double,_const_double_&,_unsigned_long,_const_boost::property<boost::edge_weight_t,_double,_boost::no_property>,_boost::edge_weight_t>,_boost::edge_weight_t,_boost::bgl_named_params<unsigned_long_*,_boost::vertex_predecessor_t,_boost::no_property>_>_>_>
                       *)p,in_stack_ffffffffffffff2c);
  make_dijkstra_visitor<boost::null_visitor>();
  choose_param<boost::dijkstra_visitor<boost::null_visitor>>(ptVar7,local_8a);
  dijkstra_shortest_paths<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::property<boost::vertex_distance_t,int,boost::no_property>,boost::property<boost::edge_weight_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::dijkstra_visitor<boost::null_visitor>,unsigned_long*,boost::iterator_property_map<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,double,double&>,boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,std::less<double>,boost::detail::_project2nd<double,double>,double,double,boost::detail::_project2nd<double,double>,boost::distance_combine_t,boost::bgl_named_params<std::less<double>,boost::distance_compare_t,boost::bgl_named_params<boost::adj_list_edge_property_map<boost::undirected_tag,double,double_const&,unsigned_long,boost::property<boost::edge_weight_t,double,boost::no_property>const,boost::edge_weight_t>,boost::edge_weight_t,boost::bgl_named_params<unsigned_long*,boost::vertex_predecessor_t,boost::no_property>>>>
            (dVar2,dVar8,uVar4,uVar3,puVar1,local_60,local_64,local_30);
  return;
}

Assistant:

inline void
    dijkstra_dispatch2
      (const VertexListGraph& g,
       typename graph_traits<VertexListGraph>::vertex_descriptor s,
       DistanceMap distance, WeightMap weight, IndexMap index_map,
       const Params& params)
    {
      // Default for predecessor map
      dummy_property_map p_map;

      typedef typename property_traits<DistanceMap>::value_type D;
      D inf = choose_param(get_param(params, distance_inf_t()),
                           (std::numeric_limits<D>::max)());

      dijkstra_shortest_paths
        (g, s,
         choose_param(get_param(params, vertex_predecessor), p_map),
         distance, weight, index_map,
         choose_param(get_param(params, distance_compare_t()),
                      std::less<D>()),
         choose_param(get_param(params, distance_combine_t()),
                      closed_plus<D>(inf)),
         inf,
         choose_param(get_param(params, distance_zero_t()),
                      D()),
         choose_param(get_param(params, graph_visitor),
                      make_dijkstra_visitor(null_visitor())),
         params);
    }